

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_setup(nk_context *ctx,nk_user_font *font)

{
  nk_context *__s;
  ulong uVar1;
  ulong uVar2;
  
  if (ctx != (nk_context *)0x0) {
    uVar1 = (ulong)ctx & 3;
    if (uVar1 == 0) {
      uVar2 = 0x40d0;
      __s = ctx;
    }
    else {
      memset(ctx,0,4 - uVar1);
      uVar2 = uVar1 | 0x40cc;
      __s = (nk_context *)((4 - uVar1) + (long)ctx);
    }
    uVar1 = (ulong)((uint)uVar2 & 0xfffffffc);
    memset(__s,0,uVar1);
    if ((uVar2 & 3) != 0) {
      memset((void *)((long)&(__s->input).keyboard.keys[0].down + uVar1),0,uVar2 & 3);
    }
    nk_style_from_table(ctx,(nk_color *)0x0);
    ctx->seq = 1;
    if (font != (nk_user_font *)0x0) {
      (ctx->style).font = font;
    }
    nk_draw_list_init(&ctx->draw_list);
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x3e41,"void nk_setup(struct nk_context *, const struct nk_user_font *)");
}

Assistant:

NK_INTERN void
nk_setup(struct nk_context *ctx, const struct nk_user_font *font)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_zero_struct(*ctx);
    nk_style_default(ctx);
    ctx->seq = 1;
    if (font) ctx->style.font = font;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_init(&ctx->draw_list);
#endif
}